

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraySlice.c
# Opt level: O0

sysbvm_tuple_t sysbvm_arraySlice_at(sysbvm_tuple_t arraySlice,size_t index)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  sysbvm_size_t sVar3;
  size_t size;
  size_t offset;
  sysbvm_arraySlice_t *arraySliceObject;
  size_t index_local;
  sysbvm_tuple_t arraySlice_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(arraySlice);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(arraySlice + 0x18));
    sVar3 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(arraySlice + 0x20));
    if (sVar3 <= index) {
      sysbvm_error_indexOutOfBounds();
    }
    arraySlice_local =
         sysbvm_arrayOrByteArray_at(*(sysbvm_tuple_t *)(arraySlice + 0x10),sVar2 + index);
  }
  else {
    arraySlice_local = 0;
  }
  return arraySlice_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_arraySlice_at(sysbvm_tuple_t arraySlice, size_t index)
{
    if(!sysbvm_tuple_isNonNullPointer(arraySlice)) return SYSBVM_NULL_TUPLE;

    sysbvm_arraySlice_t *arraySliceObject = (sysbvm_arraySlice_t*)arraySlice;
    size_t offset = sysbvm_tuple_size_decode(arraySliceObject->offset);
    size_t size = sysbvm_tuple_size_decode(arraySliceObject->size);
    if(index >= size)
        sysbvm_error_indexOutOfBounds();

    return sysbvm_arrayOrByteArray_at(arraySliceObject->elements, offset + index);
}